

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall sznet::Logger::Impl::finish(Impl *this)

{
  char *pcVar1;
  self *s;
  LogStream *pLVar2;
  char **ppcVar3;
  
  s = LogStream::operator<<(&this->m_stream," - ");
  pLVar2 = operator<<(s,&this->m_basename);
  pcVar1 = (pLVar2->m_buffer).m_cur;
  ppcVar3 = &(pLVar2->m_buffer).m_cur;
  if (((int)ppcVar3 - (int)pcVar1 & 0xfffffffeU) != 0) {
    *pcVar1 = ':';
    *ppcVar3 = *ppcVar3 + 1;
  }
  pLVar2 = LogStream::operator<<(pLVar2,this->m_line);
  pcVar1 = (pLVar2->m_buffer).m_cur;
  ppcVar3 = &(pLVar2->m_buffer).m_cur;
  if (((int)ppcVar3 - (int)pcVar1 & 0xfffffffeU) != 0) {
    *pcVar1 = '\n';
    *ppcVar3 = *ppcVar3 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
	m_stream << " - " << m_basename << ':' << m_line << '\n';
}